

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_address.cpp
# Opt level: O2

int CfdCreateConfidentialAddress
              (void *handle,char *address,char *confidential_key,char **confidential_address)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Pubkey key;
  ElementsAddressFactory factory;
  ElementsConfidentialAddress confidential_addr;
  ElementsConfidentialAddress local_350;
  Address addr;
  
  cfd::Initialize();
  if (confidential_address == (char **)0x0) {
    confidential_addr.unblinded_address_._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
         + 0x56;
    confidential_addr.unblinded_address_.witness_ver_ = 0x49;
    confidential_addr.unblinded_address_.address_._M_dataplus._M_p = "CfdCreateConfidentialAddress";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&confidential_addr,"confidential address is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&confidential_addr,"Failed to parameter. confidential address is null.",
               (allocator *)&local_350);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&confidential_addr);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(address);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(confidential_key);
    if (!bVar1) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(&factory);
      std::__cxx11::string::string((string *)&confidential_addr,address,(allocator *)&local_350);
      cfd::AddressFactory::GetAddress
                (&addr,&factory.super_AddressFactory,(string *)&confidential_addr);
      std::__cxx11::string::~string((string *)&confidential_addr);
      std::__cxx11::string::string
                ((string *)&confidential_addr,confidential_key,(allocator *)&local_350);
      cfd::core::Pubkey::Pubkey(&key,(string *)&confidential_addr);
      std::__cxx11::string::~string((string *)&confidential_addr);
      cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&confidential_addr);
      cfd::ElementsAddressFactory::GetConfidentialAddress(&local_350,&addr,&key);
      cfd::core::ElementsConfidentialAddress::operator=(&confidential_addr,&local_350);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_350);
      cfd::core::ElementsConfidentialAddress::GetAddress_abi_cxx11_
                ((string *)&local_350,&confidential_addr);
      pcVar2 = cfd::capi::CreateString((string *)&local_350);
      *confidential_address = pcVar2;
      std::__cxx11::string::~string((string *)&local_350);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&confidential_addr);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
      cfd::core::Address::~Address(&addr);
      cfd::AddressFactory::~AddressFactory(&factory.super_AddressFactory);
      return 0;
    }
    confidential_addr.unblinded_address_._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
         + 0x56;
    confidential_addr.unblinded_address_.witness_ver_ = 0x55;
    confidential_addr.unblinded_address_.address_._M_dataplus._M_p = "CfdCreateConfidentialAddress";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&confidential_addr,"confidential key is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&confidential_addr,
               "Failed to parameter. confidential key is null or empty.",(allocator *)&local_350);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&confidential_addr);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  confidential_addr.unblinded_address_._0_8_ =
       (long)
       "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_address.cpp"
       + 0x56;
  confidential_addr.unblinded_address_.witness_ver_ = 0x4f;
  confidential_addr.unblinded_address_.address_._M_dataplus._M_p = "CfdCreateConfidentialAddress";
  cfd::core::logger::warn<>((CfdSourceLocation *)&confidential_addr,"address is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&confidential_addr,"Failed to parameter. address is null or empty.",
             (allocator *)&local_350);
  cfd::core::CfdException::CfdException
            (pCVar3,kCfdIllegalArgumentError,(string *)&confidential_addr);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCreateConfidentialAddress(
    void* handle, const char* address, const char* confidential_key,
    char** confidential_address) {
  try {
    cfd::Initialize();
    if (confidential_address == nullptr) {
      warn(CFD_LOG_SOURCE, "confidential address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential address is null.");
    }
    if (IsEmptyString(address)) {
      warn(CFD_LOG_SOURCE, "address is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null or empty.");
    }
    if (IsEmptyString(confidential_key)) {
      warn(CFD_LOG_SOURCE, "confidential key is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. confidential key is null or empty.");
    }

    ElementsAddressFactory factory;
    Address addr = factory.GetAddress(address);
    Pubkey key = Pubkey(confidential_key);

    ElementsConfidentialAddress confidential_addr;
    confidential_addr = factory.GetConfidentialAddress(addr, key);
    *confidential_address = CreateString(confidential_addr.GetAddress());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}